

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int yaml_parser_parse_node
              (yaml_parser_t *parser,yaml_event_t *event,int block,int indentless_sequence)

{
  yaml_mark_t *pyVar1;
  yaml_token_type_t yVar2;
  yaml_parser_state_t *pyVar3;
  yaml_tag_directive_t *pyVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  size_t __n;
  size_t __n_00;
  yaml_char_t *__s1;
  yaml_char_t *pyVar11;
  yaml_char_t *__s;
  char *pcVar12;
  uint uVar13;
  yaml_tag_directive_t *pyVar14;
  yaml_token_t *pyVar15;
  yaml_char_t *__s2;
  yaml_version_directive_t *ptr;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  yaml_mark_t tag_mark;
  size_t local_c8;
  size_t sStack_c0;
  size_t local_b8;
  size_t local_a8;
  size_t sStack_a0;
  size_t local_98;
  size_t local_68;
  size_t sStack_60;
  size_t local_58;
  
  if ((parser->token_available == 0) && (iVar9 = yaml_parser_fetch_more_tokens(parser), iVar9 == 0))
  {
    pyVar15 = (yaml_token_t *)0x0;
  }
  else {
    pyVar15 = (parser->tokens).head;
  }
  if (pyVar15 == (yaml_token_t *)0x0) {
    return 0;
  }
  yVar2 = pyVar15->type;
  if (yVar2 == YAML_ALIAS_TOKEN) {
    pyVar3 = (parser->states).top;
    (parser->states).top = pyVar3 + -1;
    parser->state = pyVar3[-1];
    *(undefined8 *)event = 0;
    (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
    (event->end_mark).index = 0;
    (event->end_mark).line = 0;
    (event->start_mark).line = 0;
    (event->start_mark).column = 0;
    *(undefined8 *)((long)&event->data + 0x28) = 0;
    (event->start_mark).index = 0;
    (event->data).scalar.length = 0;
    *(undefined8 *)((long)&event->data + 0x20) = 0;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
    (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
    (event->end_mark).column = 0;
    event->type = YAML_ALIAS_EVENT;
    (event->start_mark).column = (pyVar15->start_mark).column;
    sVar5 = (pyVar15->start_mark).line;
    (event->start_mark).index = (pyVar15->start_mark).index;
    (event->start_mark).line = sVar5;
    sVar5 = (pyVar15->end_mark).line;
    (event->end_mark).index = (pyVar15->end_mark).index;
    (event->end_mark).line = sVar5;
    (event->end_mark).column = (pyVar15->end_mark).column;
    (event->data).document_start.version_directive =
         (yaml_version_directive_t *)(pyVar15->data).alias.value;
    goto LAB_001068b3;
  }
  pyVar1 = &pyVar15->start_mark;
  local_b8 = (pyVar15->start_mark).column;
  local_c8 = (pyVar15->start_mark).index;
  sStack_c0 = (pyVar15->start_mark).line;
  local_a8 = (pyVar15->start_mark).index;
  sStack_a0 = (pyVar15->start_mark).line;
  local_98 = (pyVar15->start_mark).column;
  if (yVar2 == YAML_TAG_TOKEN) {
    __s2 = (pyVar15->data).tag.handle;
    __s = (pyVar15->data).tag.suffix;
    local_58 = (pyVar15->start_mark).column;
    local_68 = pyVar1->index;
    sStack_60 = (pyVar15->start_mark).line;
    local_98 = (pyVar15->start_mark).column;
    local_a8 = pyVar1->index;
    sStack_a0 = (pyVar15->start_mark).line;
    local_b8 = (pyVar15->end_mark).column;
    local_c8 = (pyVar15->end_mark).index;
    sStack_c0 = (pyVar15->end_mark).line;
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    pyVar15 = (parser->tokens).head;
    parser->stream_end_produced = (uint)(pyVar15->type == YAML_STREAM_END_TOKEN);
    (parser->tokens).head = pyVar15 + 1;
    iVar9 = yaml_parser_fetch_more_tokens(parser);
    if (iVar9 == 0) {
      pyVar15 = (yaml_token_t *)0x0;
    }
    else {
      pyVar15 = (parser->tokens).head;
    }
    if (pyVar15 != (yaml_token_t *)0x0) {
      if (pyVar15->type != YAML_ANCHOR_TOKEN) goto LAB_00106b0e;
      ptr = (yaml_version_directive_t *)(pyVar15->data).tag.handle;
LAB_00106ab2:
      local_b8 = (pyVar15->end_mark).column;
      local_c8 = (pyVar15->end_mark).index;
      sStack_c0 = (pyVar15->end_mark).line;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      pyVar15 = (parser->tokens).head;
      parser->stream_end_produced = (uint)(pyVar15->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = pyVar15 + 1;
      iVar9 = yaml_parser_fetch_more_tokens(parser);
      if (iVar9 == 0) {
        pyVar15 = (yaml_token_t *)0x0;
      }
      else {
        pyVar15 = (parser->tokens).head;
      }
      if (pyVar15 == (yaml_token_t *)0x0) {
        __s1 = (yaml_char_t *)0x0;
        goto LAB_00106e14;
      }
      goto LAB_00106b30;
    }
LAB_00106b15:
    __s1 = (yaml_char_t *)0x0;
    ptr = (yaml_version_directive_t *)0x0;
LAB_00106e14:
    yaml_free(ptr);
    yaml_free(__s2);
    yaml_free(__s);
    yaml_free(__s1);
    return 0;
  }
  if (yVar2 == YAML_ANCHOR_TOKEN) {
    ptr = (yaml_version_directive_t *)(pyVar15->data).tag.handle;
    local_98 = (pyVar15->start_mark).column;
    local_a8 = pyVar1->index;
    sStack_a0 = (pyVar15->start_mark).line;
    local_b8 = (pyVar15->end_mark).column;
    local_c8 = (pyVar15->end_mark).index;
    sStack_c0 = (pyVar15->end_mark).line;
    parser->token_available = 0;
    parser->tokens_parsed = parser->tokens_parsed + 1;
    pyVar15 = (parser->tokens).head;
    parser->stream_end_produced = (uint)(pyVar15->type == YAML_STREAM_END_TOKEN);
    (parser->tokens).head = pyVar15 + 1;
    iVar9 = yaml_parser_fetch_more_tokens(parser);
    if (iVar9 == 0) {
      pyVar15 = (yaml_token_t *)0x0;
    }
    else {
      pyVar15 = (parser->tokens).head;
    }
    if (pyVar15 == (yaml_token_t *)0x0) {
      __s = (yaml_char_t *)0x0;
      __s1 = (yaml_char_t *)0x0;
      __s2 = (yaml_char_t *)0x0;
      goto LAB_00106e14;
    }
    if (pyVar15->type == YAML_TAG_TOKEN) {
      __s2 = (pyVar15->data).tag.handle;
      __s = (pyVar15->data).tag.suffix;
      local_58 = (pyVar15->start_mark).column;
      local_68 = (pyVar15->start_mark).index;
      sStack_60 = (pyVar15->start_mark).line;
      goto LAB_00106ab2;
    }
    __s = (yaml_char_t *)0x0;
    __s2 = (yaml_char_t *)0x0;
  }
  else {
    __s = (yaml_char_t *)0x0;
    __s2 = (yaml_char_t *)0x0;
LAB_00106b0e:
    ptr = (yaml_version_directive_t *)0x0;
  }
LAB_00106b30:
  if (__s2 == (yaml_char_t *)0x0) {
    __s1 = (yaml_char_t *)0x0;
LAB_00106b8f:
    __s2 = (yaml_char_t *)0x0;
  }
  else {
    if (*__s2 == '\0') {
      yaml_free(__s2);
      __s1 = __s;
      __s = (yaml_char_t *)0x0;
      goto LAB_00106b8f;
    }
    pyVar4 = (parser->tag_directives).top;
    for (pyVar14 = (parser->tag_directives).start; pyVar14 != pyVar4; pyVar14 = pyVar14 + 1) {
      iVar9 = strcmp((char *)pyVar14->handle,(char *)__s2);
      if (iVar9 == 0) {
        __n = strlen((char *)pyVar14->prefix);
        __n_00 = strlen((char *)__s);
        __s1 = (yaml_char_t *)yaml_malloc(__n_00 + __n + 1);
        if (__s1 != (yaml_char_t *)0x0) {
          memcpy(__s1,pyVar14->prefix,__n);
          memcpy(__s1 + __n,__s,__n_00);
          __s1[__n_00 + __n] = '\0';
          yaml_free(__s2);
          yaml_free(__s);
          __s = (yaml_char_t *)0x0;
          __s2 = (yaml_char_t *)0x0;
          goto LAB_00106c58;
        }
        parser->error = YAML_MEMORY_ERROR;
        bVar8 = false;
        goto LAB_00106cae;
      }
    }
    __s1 = (yaml_char_t *)0x0;
LAB_00106c58:
    bVar8 = true;
    if (__s1 == (yaml_char_t *)0x0) {
      parser->error = YAML_PARSER_ERROR;
      parser->context = "while parsing a node";
      (parser->context_mark).index = local_a8;
      (parser->context_mark).line = sStack_a0;
      (parser->context_mark).column = local_98;
      parser->problem = "found undefined tag handle";
      (parser->problem_mark).index = local_68;
      (parser->problem_mark).line = sStack_60;
      (parser->problem_mark).column = local_58;
      __s1 = (yaml_char_t *)0x0;
      bVar8 = false;
    }
LAB_00106cae:
    if (!bVar8) goto LAB_00106e14;
  }
  if (__s1 == (yaml_char_t *)0x0) {
    uVar13 = 1;
  }
  else {
    uVar13 = (uint)(*__s1 == '\0');
  }
  if ((indentless_sequence == 0) || (pyVar15->type != YAML_BLOCK_ENTRY_TOKEN)) {
    yVar2 = pyVar15->type;
    if (yVar2 == YAML_FLOW_SEQUENCE_START_TOKEN) {
      local_b8 = (pyVar15->end_mark).column;
      local_c8 = (pyVar15->end_mark).index;
      sStack_c0 = (pyVar15->end_mark).line;
      parser->state = YAML_PARSE_FLOW_SEQUENCE_FIRST_ENTRY_STATE;
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->end_mark).index = 0;
      (event->end_mark).line = 0;
      (event->start_mark).line = 0;
      (event->start_mark).column = 0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      (event->start_mark).index = 0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      (event->end_mark).column = 0;
      event->type = YAML_SEQUENCE_START_EVENT;
    }
    else {
      if (yVar2 != YAML_FLOW_MAPPING_START_TOKEN) {
        if (yVar2 == YAML_SCALAR_TOKEN) {
          uVar13 = 0;
          sVar5 = (pyVar15->end_mark).column;
          sVar6 = (pyVar15->end_mark).index;
          sVar7 = (pyVar15->end_mark).line;
          iVar9 = 1;
          if (((__s1 != (yaml_char_t *)0x0) ||
              ((pyVar15->data).scalar.style != YAML_PLAIN_SCALAR_STYLE)) &&
             ((__s1 == (yaml_char_t *)0x0 || (iVar10 = strcmp((char *)__s1,"!"), iVar10 != 0)))) {
            uVar13 = (uint)(__s1 == (yaml_char_t *)0x0);
            iVar9 = 0;
          }
          pyVar3 = (parser->states).top;
          (parser->states).top = pyVar3 + -1;
          parser->state = pyVar3[-1];
          *(undefined8 *)event = 0;
          (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
          (event->end_mark).index = 0;
          (event->end_mark).line = 0;
          (event->start_mark).line = 0;
          (event->start_mark).column = 0;
          *(undefined8 *)((long)&event->data + 0x28) = 0;
          (event->start_mark).index = 0;
          (event->data).scalar.length = 0;
          *(undefined8 *)((long)&event->data + 0x20) = 0;
          (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
          (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
          (event->end_mark).column = 0;
          event->type = YAML_SCALAR_EVENT;
          (event->start_mark).index = local_a8;
          (event->start_mark).line = sStack_a0;
          (event->start_mark).column = local_98;
          (event->end_mark).index = sVar6;
          (event->end_mark).line = sVar7;
          (event->end_mark).column = sVar5;
          (event->data).document_start.version_directive = ptr;
          (event->data).scalar.tag = __s1;
          (event->data).document_start.tag_directives.end =
               (yaml_tag_directive_t *)(pyVar15->data).alias.value;
          (event->data).scalar.length = (size_t)(pyVar15->data).tag.suffix;
          (event->data).scalar.plain_implicit = iVar9;
          (event->data).scalar.quoted_implicit = uVar13;
          (event->data).scalar.style = (pyVar15->data).scalar.style;
LAB_001068b3:
          parser->token_available = 0;
          parser->tokens_parsed = parser->tokens_parsed + 1;
          pyVar15 = (parser->tokens).head;
          parser->stream_end_produced = (uint)(pyVar15->type == YAML_STREAM_END_TOKEN);
          (parser->tokens).head = pyVar15 + 1;
          return 1;
        }
        if ((block != 0) && (yVar2 == YAML_BLOCK_SEQUENCE_START_TOKEN)) {
          local_b8 = (pyVar15->end_mark).column;
          local_c8 = (pyVar15->end_mark).index;
          sStack_c0 = (pyVar15->end_mark).line;
          parser->state = YAML_PARSE_BLOCK_SEQUENCE_FIRST_ENTRY_STATE;
          goto LAB_00106f45;
        }
        if ((block == 0) || (yVar2 != YAML_BLOCK_MAPPING_START_TOKEN)) {
          if (ptr != (yaml_version_directive_t *)0x0 || __s1 != (yaml_char_t *)0x0) {
            pyVar11 = (yaml_char_t *)yaml_malloc(1);
            if (pyVar11 != (yaml_char_t *)0x0) {
              *pyVar11 = '\0';
              pyVar3 = (parser->states).top;
              (parser->states).top = pyVar3 + -1;
              parser->state = pyVar3[-1];
              *(undefined8 *)event = 0;
              (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
              (event->end_mark).column = 0;
              (event->end_mark).index = 0;
              (event->end_mark).line = 0;
              (event->start_mark).line = 0;
              (event->start_mark).column = 0;
              *(undefined8 *)((long)&event->data + 0x28) = 0;
              (event->start_mark).index = 0;
              (event->data).scalar.length = 0;
              *(undefined8 *)((long)&event->data + 0x20) = 0;
              (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
              (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
              event->type = YAML_SCALAR_EVENT;
              (event->start_mark).index = local_a8;
              (event->start_mark).line = sStack_a0;
              (event->start_mark).column = local_98;
              (event->end_mark).index = local_c8;
              (event->end_mark).line = sStack_c0;
              (event->end_mark).column = local_b8;
              (event->data).document_start.version_directive = ptr;
              (event->data).scalar.tag = __s1;
              (event->data).scalar.value = pyVar11;
              (event->data).scalar.length = 0;
              (event->data).scalar.plain_implicit = uVar13;
              *(undefined8 *)((long)&event->data + 0x24) = 0x100000000;
              return 1;
            }
            parser->error = YAML_MEMORY_ERROR;
            goto LAB_00106e14;
          }
          pcVar12 = "while parsing a flow node";
          if (block != 0) {
            pcVar12 = "while parsing a block node";
          }
          sVar5 = (pyVar15->start_mark).column;
          sVar6 = (pyVar15->start_mark).index;
          sVar7 = (pyVar15->start_mark).line;
          parser->error = YAML_PARSER_ERROR;
          parser->context = pcVar12;
          (parser->context_mark).index = local_a8;
          (parser->context_mark).line = sStack_a0;
          (parser->context_mark).column = local_98;
          parser->problem = "did not find expected node content";
          (parser->problem_mark).index = sVar6;
          (parser->problem_mark).line = sVar7;
          (parser->problem_mark).column = sVar5;
          goto LAB_00106b15;
        }
        local_b8 = (pyVar15->end_mark).column;
        local_c8 = (pyVar15->end_mark).index;
        sStack_c0 = (pyVar15->end_mark).line;
        parser->state = YAML_PARSE_BLOCK_MAPPING_FIRST_KEY_STATE;
        *(undefined8 *)event = 0;
        (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
        (event->end_mark).index = 0;
        (event->end_mark).line = 0;
        (event->start_mark).line = 0;
        (event->start_mark).column = 0;
        *(undefined8 *)((long)&event->data + 0x28) = 0;
        (event->start_mark).index = 0;
        (event->data).scalar.length = 0;
        *(undefined8 *)((long)&event->data + 0x20) = 0;
        (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
        (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
        (event->end_mark).column = 0;
        event->type = YAML_MAPPING_START_EVENT;
        goto LAB_00106f6d;
      }
      local_b8 = (pyVar15->end_mark).column;
      local_c8 = (pyVar15->end_mark).index;
      sStack_c0 = (pyVar15->end_mark).line;
      parser->state = YAML_PARSE_FLOW_MAPPING_FIRST_KEY_STATE;
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->end_mark).index = 0;
      (event->end_mark).line = 0;
      (event->start_mark).line = 0;
      (event->start_mark).column = 0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      (event->start_mark).index = 0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      (event->end_mark).column = 0;
      event->type = YAML_MAPPING_START_EVENT;
    }
    (event->start_mark).index = local_a8;
    (event->start_mark).line = sStack_a0;
    (event->start_mark).column = local_98;
    (event->end_mark).index = local_c8;
    (event->end_mark).line = sStack_c0;
    (event->end_mark).column = local_b8;
    (event->data).document_start.version_directive = ptr;
    (event->data).scalar.tag = __s1;
    (event->data).sequence_start.implicit = uVar13;
    (event->data).sequence_start.style = YAML_FLOW_SEQUENCE_STYLE;
  }
  else {
    local_b8 = (pyVar15->end_mark).column;
    local_c8 = (pyVar15->end_mark).index;
    sStack_c0 = (pyVar15->end_mark).line;
    parser->state = YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE;
LAB_00106f45:
    *(undefined8 *)event = 0;
    (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
    (event->end_mark).index = 0;
    (event->end_mark).line = 0;
    (event->start_mark).line = 0;
    (event->start_mark).column = 0;
    *(undefined8 *)((long)&event->data + 0x28) = 0;
    (event->start_mark).index = 0;
    (event->data).scalar.length = 0;
    *(undefined8 *)((long)&event->data + 0x20) = 0;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
    (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
    (event->end_mark).column = 0;
    event->type = YAML_SEQUENCE_START_EVENT;
LAB_00106f6d:
    (event->start_mark).index = local_a8;
    (event->start_mark).line = sStack_a0;
    (event->start_mark).column = local_98;
    (event->end_mark).index = local_c8;
    (event->end_mark).line = sStack_c0;
    (event->end_mark).column = local_b8;
    (event->data).document_start.version_directive = ptr;
    (event->data).scalar.tag = __s1;
    (event->data).sequence_start.implicit = uVar13;
    (event->data).sequence_start.style = YAML_BLOCK_SEQUENCE_STYLE;
  }
  return 1;
}

Assistant:

static int
yaml_parser_parse_node(yaml_parser_t *parser, yaml_event_t *event,
        int block, int indentless_sequence)
{
    yaml_token_t *token;
    yaml_char_t *anchor = NULL;
    yaml_char_t *tag_handle = NULL;
    yaml_char_t *tag_suffix = NULL;
    yaml_char_t *tag = NULL;
    yaml_mark_t start_mark, end_mark, tag_mark;
    int implicit;

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    if (token->type == YAML_ALIAS_TOKEN)
    {
        parser->state = POP(parser, parser->states);
        ALIAS_EVENT_INIT(*event, token->data.alias.value,
                token->start_mark, token->end_mark);
        SKIP_TOKEN(parser);
        return 1;
    }

    else
    {
        start_mark = end_mark = token->start_mark;

        if (token->type == YAML_ANCHOR_TOKEN)
        {
            anchor = token->data.anchor.value;
            start_mark = token->start_mark;
            end_mark = token->end_mark;
            SKIP_TOKEN(parser);
            token = PEEK_TOKEN(parser);
            if (!token) goto error;
            if (token->type == YAML_TAG_TOKEN)
            {
                tag_handle = token->data.tag.handle;
                tag_suffix = token->data.tag.suffix;
                tag_mark = token->start_mark;
                end_mark = token->end_mark;
                SKIP_TOKEN(parser);
                token = PEEK_TOKEN(parser);
                if (!token) goto error;
            }
        }
        else if (token->type == YAML_TAG_TOKEN)
        {
            tag_handle = token->data.tag.handle;
            tag_suffix = token->data.tag.suffix;
            start_mark = tag_mark = token->start_mark;
            end_mark = token->end_mark;
            SKIP_TOKEN(parser);
            token = PEEK_TOKEN(parser);
            if (!token) goto error;
            if (token->type == YAML_ANCHOR_TOKEN)
            {
                anchor = token->data.anchor.value;
                end_mark = token->end_mark;
                SKIP_TOKEN(parser);
                token = PEEK_TOKEN(parser);
                if (!token) goto error;
            }
        }

        if (tag_handle) {
            if (!*tag_handle) {
                tag = tag_suffix;
                yaml_free(tag_handle);
                tag_handle = tag_suffix = NULL;
            }
            else {
                yaml_tag_directive_t *tag_directive;
                for (tag_directive = parser->tag_directives.start;
                        tag_directive != parser->tag_directives.top;
                        tag_directive ++) {
                    if (strcmp((char *)tag_directive->handle, (char *)tag_handle) == 0) {
                        size_t prefix_len = strlen((char *)tag_directive->prefix);
                        size_t suffix_len = strlen((char *)tag_suffix);
                        tag = YAML_MALLOC(prefix_len+suffix_len+1);
                        if (!tag) {
                            parser->error = YAML_MEMORY_ERROR;
                            goto error;
                        }
                        memcpy(tag, tag_directive->prefix, prefix_len);
                        memcpy(tag+prefix_len, tag_suffix, suffix_len);
                        tag[prefix_len+suffix_len] = '\0';
                        yaml_free(tag_handle);
                        yaml_free(tag_suffix);
                        tag_handle = tag_suffix = NULL;
                        break;
                    }
                }
                if (!tag) {
                    yaml_parser_set_parser_error_context(parser,
                            "while parsing a node", start_mark,
                            "found undefined tag handle", tag_mark);
                    goto error;
                }
            }
        }

        implicit = (!tag || !*tag);
        if (indentless_sequence && token->type == YAML_BLOCK_ENTRY_TOKEN) {
            end_mark = token->end_mark;
            parser->state = YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE;
            SEQUENCE_START_EVENT_INIT(*event, anchor, tag, implicit,
                    YAML_BLOCK_SEQUENCE_STYLE, start_mark, end_mark);
            return 1;
        }
        else {
            if (token->type == YAML_SCALAR_TOKEN) {
                int plain_implicit = 0;
                int quoted_implicit = 0;
                end_mark = token->end_mark;
                if ((token->data.scalar.style == YAML_PLAIN_SCALAR_STYLE && !tag)
                        || (tag && strcmp((char *)tag, "!") == 0)) {
                    plain_implicit = 1;
                }
                else if (!tag) {
                    quoted_implicit = 1;
                }
                parser->state = POP(parser, parser->states);
                SCALAR_EVENT_INIT(*event, anchor, tag,
                        token->data.scalar.value, token->data.scalar.length,
                        plain_implicit, quoted_implicit,
                        token->data.scalar.style, start_mark, end_mark);
                SKIP_TOKEN(parser);
                return 1;
            }
            else if (token->type == YAML_FLOW_SEQUENCE_START_TOKEN) {
                end_mark = token->end_mark;
                parser->state = YAML_PARSE_FLOW_SEQUENCE_FIRST_ENTRY_STATE;
                SEQUENCE_START_EVENT_INIT(*event, anchor, tag, implicit,
                        YAML_FLOW_SEQUENCE_STYLE, start_mark, end_mark);
                return 1;
            }
            else if (token->type == YAML_FLOW_MAPPING_START_TOKEN) {
                end_mark = token->end_mark;
                parser->state = YAML_PARSE_FLOW_MAPPING_FIRST_KEY_STATE;
                MAPPING_START_EVENT_INIT(*event, anchor, tag, implicit,
                        YAML_FLOW_MAPPING_STYLE, start_mark, end_mark);
                return 1;
            }
            else if (block && token->type == YAML_BLOCK_SEQUENCE_START_TOKEN) {
                end_mark = token->end_mark;
                parser->state = YAML_PARSE_BLOCK_SEQUENCE_FIRST_ENTRY_STATE;
                SEQUENCE_START_EVENT_INIT(*event, anchor, tag, implicit,
                        YAML_BLOCK_SEQUENCE_STYLE, start_mark, end_mark);
                return 1;
            }
            else if (block && token->type == YAML_BLOCK_MAPPING_START_TOKEN) {
                end_mark = token->end_mark;
                parser->state = YAML_PARSE_BLOCK_MAPPING_FIRST_KEY_STATE;
                MAPPING_START_EVENT_INIT(*event, anchor, tag, implicit,
                        YAML_BLOCK_MAPPING_STYLE, start_mark, end_mark);
                return 1;
            }
            else if (anchor || tag) {
                yaml_char_t *value = YAML_MALLOC(1);
                if (!value) {
                    parser->error = YAML_MEMORY_ERROR;
                    goto error;
                }
                value[0] = '\0';
                parser->state = POP(parser, parser->states);
                SCALAR_EVENT_INIT(*event, anchor, tag, value, 0,
                        implicit, 0, YAML_PLAIN_SCALAR_STYLE,
                        start_mark, end_mark);
                return 1;
            }
            else {
                yaml_parser_set_parser_error_context(parser,
                        (block ? "while parsing a block node"
                         : "while parsing a flow node"), start_mark,
                        "did not find expected node content", token->start_mark);
                goto error;
            }
        }
    }

error:
    yaml_free(anchor);
    yaml_free(tag_handle);
    yaml_free(tag_suffix);
    yaml_free(tag);

    return 0;
}